

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O2

void __thiscall
re2c::Node::cover<unsigned_int,unsigned_char>
          (Node *this,path_t *prefix,FILE *input,FILE *keys,covers_t *size)

{
  uint uVar1;
  rule_t rVar2;
  pointer ppvVar3;
  long lVar4;
  pointer puVar5;
  bool bVar6;
  uint uVar7;
  size_t i;
  path_t *ppVar8;
  ulong uVar9;
  uint *__ptr;
  _Base_ptr p_Var10;
  ulong uVar11;
  uint *puVar12;
  ulong count;
  size_t j;
  ulong uVar13;
  ulong len;
  uint *puVar14;
  path_t new_prefix;
  
  bVar6 = end(this);
  ppVar8 = this->suffix;
  if (bVar6) {
    if (ppVar8 == (path_t *)0x0) {
      ppVar8 = (path_t *)operator_new(0x38);
      rVar2 = this->rule;
      bVar6 = this->ctx;
      (ppVar8->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (ppVar8->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (ppVar8->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVar8->rule = rVar2;
      ppVar8->rule_pos = 0;
      ppVar8->ctx = bVar6;
      ppVar8->ctx_pos = 0;
      this->suffix = ppVar8;
    }
  }
  else if (ppVar8 == (path_t *)0x0) {
    if (1 < this->loop) {
      return;
    }
    this->loop = this->loop + 1;
    p_Var10 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (((_Rb_tree_header *)p_Var10 != &(this->arcs)._M_t._M_impl.super__Rb_tree_header &&
           (size->value != 0x40000000))) {
      path_t::path_t(&new_prefix,prefix);
      path_t::extend(&new_prefix,*(rule_t *)(*(long *)(p_Var10 + 1) + 100),
                     *(bool *)(*(long *)(p_Var10 + 1) + 0x6c),(arc_t *)&p_Var10[1]._M_parent);
      cover<unsigned_int,unsigned_char>(*(Node **)(p_Var10 + 1),&new_prefix,input,keys,size);
      if ((*(long *)(*(long *)(p_Var10 + 1) + 0xa8) != 0) && (this->suffix == (path_t *)0x0)) {
        ppVar8 = (path_t *)operator_new(0x38);
        rVar2 = this->rule;
        bVar6 = this->ctx;
        (ppVar8->arcs).
        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (ppVar8->arcs).
        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (ppVar8->arcs).
        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppVar8->rule = rVar2;
        ppVar8->rule_pos = 0;
        ppVar8->ctx = bVar6;
        ppVar8->ctx_pos = 0;
        this->suffix = ppVar8;
        path_t::extend(ppVar8,*(rule_t *)(*(long *)(p_Var10 + 1) + 100),
                       *(bool *)(*(long *)(p_Var10 + 1) + 0x6c),(arc_t *)&p_Var10[1]._M_parent);
        path_t::append(this->suffix,*(path_t **)(*(long *)(p_Var10 + 1) + 0xa8));
      }
      std::
      _Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::~_Vector_base((_Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)&new_prefix);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    }
    this->loop = this->loop + 0xff;
    return;
  }
  path_t::append(prefix,ppVar8);
  uVar1 = size->value;
  ppvVar3 = (prefix->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  len = (long)(prefix->arcs).
              super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3;
  count = 0;
  for (uVar9 = 0; len != uVar9; uVar9 = uVar9 + 1) {
    uVar11 = (long)*(pointer *)
                    ((long)&(ppvVar3[uVar9]->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    + 8) -
             *(long *)&(ppvVar3[uVar9]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl >> 2
    ;
    if (count <= uVar11) {
      count = uVar11;
    }
  }
  uVar9 = 0x40000000;
  if (len < 0x40000000) {
    uVar9 = len;
  }
  uVar11 = 0x40000000;
  if (count < 0x40000000) {
    uVar11 = count;
  }
  uVar11 = uVar11 * uVar9;
  uVar9 = 0x40000000;
  if (uVar11 < 0x40000000) {
    __ptr = (uint *)operator_new__(uVar11 * 4);
    puVar12 = __ptr;
    for (uVar9 = 0; uVar9 != len; uVar9 = uVar9 + 1) {
      lVar4 = *(long *)&(ppvVar3[uVar9]->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
      puVar5 = *(pointer *)
                ((long)&(ppvVar3[uVar9]->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl + 8
                );
      puVar14 = puVar12;
      for (uVar13 = 0; count != uVar13; uVar13 = uVar13 + 1) {
        uVar7 = to_le<unsigned_int>(*(uint *)(lVar4 + (uVar13 % (ulong)((long)puVar5 - lVar4 >> 2))
                                                      * 4));
        *puVar14 = uVar7;
        puVar14 = puVar14 + len;
      }
      puVar12 = puVar12 + 1;
    }
    fwrite(__ptr,4,uVar11,(FILE *)input);
    operator_delete__(__ptr);
    keygen<unsigned_char>
              (keys,count,len,(&prefix->rule_pos)[(ulong)(prefix->rule).restorectx * 2],
               (rule_rank_t)(prefix->rule).rank.value);
    uVar9 = uVar11;
  }
  uVar9 = uVar9 + uVar1;
  if (0x3fffffff < uVar9) {
    uVar9 = 0x40000000;
  }
  size->value = (uint32_t)uVar9;
  return;
}

Assistant:

void Node::cover (path_t & prefix, FILE * input, FILE * keys, covers_t &size)
{
	if (end () && suffix == NULL)
	{
		suffix = new path_t (rule, ctx);
	}
	if (suffix != NULL)
	{
		prefix.append (suffix);
		size = size + cover_one<cunit_t, key_t> (input, keys, prefix);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin ();
			i != arcs.end () && !size.overflow(); ++i)
		{
			path_t new_prefix = prefix;
			new_prefix.extend (i->first->rule, i->first->ctx, &i->second);
			i->first->cover<cunit_t, key_t> (new_prefix, input, keys, size);
			if (i->first->suffix != NULL && suffix == NULL)
			{
				suffix = new path_t (rule, ctx);
				suffix->extend (i->first->rule, i->first->ctx, &i->second);
				suffix->append (i->first->suffix);
			}
		}
	}
}